

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_end(archive *a,la_zstream *lastrm)

{
  long in_RSI;
  undefined8 in_RDI;
  undefined4 local_4;
  
  if (*(int *)(in_RSI + 0x40) == 0) {
    local_4 = 0;
  }
  else {
    *(undefined4 *)(in_RSI + 0x30) = 0;
    free(*(void **)(in_RSI + 0x38));
    *(undefined8 *)(in_RSI + 0x38) = 0;
    local_4 = (**(code **)(in_RSI + 0x58))(in_RDI,in_RSI);
  }
  return local_4;
}

Assistant:

static int
compression_end(struct archive *a, struct la_zstream *lastrm)
{
	if (lastrm->valid) {
		lastrm->prop_size = 0;
		free(lastrm->props);
		lastrm->props = NULL;
		return (lastrm->end(a, lastrm));
	}
	return (ARCHIVE_OK);
}